

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

void __thiscall
Pathie::Path::Path(Path *this,vector<Pathie::Path,_std::allocator<Pathie::Path>_> *components)

{
  pointer pcVar1;
  pointer pPVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (this->m_path)._M_dataplus._M_p = (pointer)&(this->m_path).field_2;
  (this->m_path)._M_string_length = 0;
  (this->m_path).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  if (0x20 < (ulong)((long)(components->
                           super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(components->
                          super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
                          super__Vector_impl_data._M_start)) {
    if (*(this->m_path)._M_dataplus._M_p != '/') {
      std::__cxx11::string::append((char *)this);
    }
    pPVar2 = (components->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
             super__Vector_impl_data._M_start + 1;
    if (pPVar2 != (components->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>).
                  _M_impl.super__Vector_impl_data._M_finish) {
      do {
        pcVar1 = (pPVar2->m_path)._M_dataplus._M_p;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,pcVar1,pcVar1 + (pPVar2->m_path)._M_string_length);
        std::__cxx11::string::append((char *)local_50);
        std::__cxx11::string::_M_append((char *)this,(ulong)local_50[0]);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        pPVar2 = pPVar2 + 1;
      } while (pPVar2 != (components->
                         super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)this);
    std::__cxx11::string::_M_assign((string *)this);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  return;
}

Assistant:

Path::Path(const std::vector<Path>& components)
{
  m_path = components.front().m_path;

  if (components.size() > 1) {
    // Ensure that for both absolute and relative path we end in
    // a slash for appending below
    if (m_path[0] != '/') {
      m_path += "/";
    }

    std::vector<Path>::const_iterator iter;
    for(iter=components.begin()+1; iter != components.end(); iter++) { // first element has already been taken care of above
      m_path += (*iter).m_path + "/";
    }

    // Trailing slash is unwanted, remove it
    m_path = m_path.substr(0, m_path.length()-1);
  }
}